

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O0

void __thiscall helics::SmallBuffer::SmallBuffer(SmallBuffer *this,SmallBuffer *sb)

{
  byte *__src;
  pointer pvVar1;
  size_t __n;
  SmallBuffer *in_RSI;
  undefined1 *in_RDI;
  SmallBuffer *in_stack_ffffffffffffffe0;
  void *__dest;
  
  memset(in_RDI,0,0x40);
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0x40;
  pvVar1 = std::array<std::byte,_64UL>::data((array<std::byte,_64UL> *)0x3dee2f);
  *(pointer *)(in_RDI + 0x50) = pvVar1;
  in_RDI[0x58] = 0;
  in_RDI[0x59] = 0;
  in_RDI[0x5a] = 0;
  in_RDI[0x5b] = 0;
  *(undefined4 *)(in_RDI + 0x5c) = 0;
  size(in_RSI);
  resize(in_stack_ffffffffffffffe0,(size_t)in_RDI);
  __dest = *(void **)(in_RDI + 0x50);
  __src = in_RSI->heap;
  __n = size(in_RSI);
  memcpy(__dest,__src,__n);
  return;
}

Assistant:

SmallBuffer(const SmallBuffer& sb): heap(buffer.data())
    {
        resize(sb.size());
        std::memcpy(heap, sb.heap, sb.size());
    }